

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall kj::Own<kj::TimerImpl::Impl>::dispose(Own<kj::TimerImpl::Impl> *this)

{
  if (this->ptr != (Impl *)0x0) {
    this->ptr = (Impl *)0x0;
    (**this->disposer->_vptr_Disposer)();
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }